

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetInstallNameDirForInstallTree_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&local_68,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator *)&local_48);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_68,"INSTALL_NAME_DIR",(allocator *)&local_48);
    pcVar3 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_68,"CMAKE_SKIP_RPATH",&local_69);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&local_48,"CMAKE_SKIP_INSTALL_RPATH",&local_6a);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_48);
      bVar2 = !bVar2;
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::~string((string *)&local_68);
    if ((pcVar3 == (char *)0x0) || (!bVar2)) {
      if (pcVar3 == (char *)0x0) {
        bVar2 = MacOSXRpathInstallNameDirDefault(this);
        if (bVar2) {
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
        }
      }
    }
    else if (*pcVar3 != '\0') {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetInstallNameDirForInstallTree() const
{
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if(!this->Makefile->IsOn("CMAKE_SKIP_RPATH") &&
       !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH"))
      {
      if(install_name_dir && *install_name_dir)
        {
        dir = install_name_dir;
        dir += "/";
        }
      }
    if(!install_name_dir)
      {
      if(this->MacOSXRpathInstallNameDirDefault())
        {
        dir = "@rpath/";
        }
      }
    return dir;
    }
  else
    {
    return "";
    }
}